

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_ext_any(lysc_ext_instance *ext,char *name,void *value,
                      LYD_ANYDATA_VALUETYPE value_type,uint32_t options,lyd_node **node)

{
  lysc_node *schema_00;
  ly_ctx *local_60;
  LY_ERR ret__;
  ly_bool use_value;
  ly_ctx *ctx;
  lysc_node *schema;
  lyd_node *ret;
  lyd_node **node_local;
  uint32_t options_local;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  char *name_local;
  lysc_ext_instance *ext_local;
  
  schema = (lysc_node *)0x0;
  if (ext == (lysc_ext_instance *)0x0) {
    local_60 = (ly_ctx *)0x0;
  }
  else {
    local_60 = ext->module->ctx;
  }
  ret = (lyd_node *)node;
  node_local._0_4_ = options;
  node_local._4_4_ = value_type;
  _options_local = value;
  value_local = name;
  name_local = (char *)ext;
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log(local_60,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lyd_new_ext_any");
    ext_local._4_4_ = LY_EINVAL;
  }
  else if (node == (lyd_node **)0x0) {
    ly_log(local_60,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_new_ext_any");
    ext_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(local_60,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_ext_any");
    ext_local._4_4_ = LY_EINVAL;
  }
  else {
    schema_00 = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0x60,0);
    if (schema_00 == (lysc_node *)0x0) {
      if (*(long *)(name_local + 8) == 0) {
        ly_log(local_60,LY_LLERR,LY_EINVAL,"Any node \"%s\" not found in instance of extension %s.",
               value_local,**(undefined8 **)name_local);
      }
      else {
        ly_log(local_60,LY_LLERR,LY_EINVAL,
               "Any node \"%s\" not found in instance \"%s\" of extension %s.",value_local,
               *(undefined8 *)(name_local + 8),**(undefined8 **)name_local);
      }
      ext_local._4_4_ = LY_ENOTFOUND;
    }
    else {
      ext_local._4_4_ =
           lyd_create_any(schema_00,_options_local,node_local._4_4_,(options & 0x100) != 0,
                          (lyd_node **)&schema);
      if (ext_local._4_4_ == LY_SUCCESS) {
        *(lysc_node **)ret = schema;
        ext_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ext_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_any(const struct lysc_ext_instance *ext, const char *name, const void *value, LYD_ANYDATA_VALUETYPE value_type,
        uint32_t options, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    ly_bool use_value = (options & LYD_NEW_ANY_USE_VALUE) ? 1 : 0;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYD_NODE_ANY, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Any node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    LY_CHECK_RET(lyd_create_any(schema, value, value_type, use_value, &ret));

    *node = ret;

    return LY_SUCCESS;
}